

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O1

void __thiscall
CryptoUtil_EncryptAes256CbcIvLengthError_Test::~CryptoUtil_EncryptAes256CbcIvLengthError_Test
          (CryptoUtil_EncryptAes256CbcIvLengthError_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256CbcIvLengthError) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    ByteData iv("1234");
    ByteData byte_data = CryptoUtil::EncryptAes256Cbc(
        key.GetBytes(), iv.GetBytes(), "aiueoaiueoaiueoaiueoaiueoaiueoai");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "EncryptAes256Cbc error.");
    return;
  }
  ASSERT_TRUE(false);
}